

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
               *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  size_t sVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = this->_has_bits_[0];
  if ((uVar1 & 1) == 0) {
    lVar6 = 0;
  }
  else {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    uVar3 = *(ulong *)CONCAT44(extraout_var,iVar2) | 1;
    lVar6 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    lVar6 = (ulong)((int)lVar6 * 9 + 0x49U >> 6) + 1;
    uVar1 = this->_has_bits_[0];
  }
  if ((uVar1 & 2) == 0) {
    lVar5 = 0;
  }
  else {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    sVar4 = WireFormatLite::StringSize((string *)CONCAT44(extraout_var_00,iVar2));
    lVar5 = (long)(int)sVar4 + 1;
  }
  return lVar5 + lVar6;
}

Assistant:

size_t ByteSizeLong() const {
    size_t size = 0;
    size += has_key() ? kTagSize + KeyTypeHandler::ByteSize(key()) : 0;
    size += has_value() ? kTagSize + ValueTypeHandler::ByteSize(value()) : 0;
    return size;
  }